

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::MessageBuilderGenerator
          (MessageBuilderGenerator *this,Descriptor *descriptor,Context *context)

{
  ClassNameResolver *pCVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  this->_vptr_MessageBuilderGenerator = (_func_int **)&PTR__MessageBuilderGenerator_004216b8;
  this->descriptor_ = descriptor;
  this->context_ = context;
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (&this->field_generators_,descriptor,this->context_);
  if (((context->options_).enforce_lite != false) ||
     (*(int *)(*(long *)(*(long *)(descriptor + 0x10) + 0xa0) + 0xa8) == 3)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder.cc"
               ,0x54);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,
                        "Generator factory error: A non-lite message generator is used to generate lite messages."
                       );
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

MessageBuilderGenerator::MessageBuilderGenerator(
    const Descriptor* descriptor, Context* context)
  : descriptor_(descriptor), context_(context),
    name_resolver_(context->GetNameResolver()),
    field_generators_(descriptor, context_) {
  GOOGLE_CHECK(HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A non-lite message generator is used to "
         "generate lite messages.";
}